

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.h
# Opt level: O0

uchar * append_uint64(uchar *cp,uint64_t i)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  uchar *cp_00;
  uint64_t j;
  uint64_t i_local;
  uchar *cp_local;
  
  if (i < 0x100000000) {
    cp_local = append_uint32(cp,(uint32_t)i);
  }
  else {
    uVar4 = i / 1000000000;
    if (uVar4 < 0x3b9aca01) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = i;
      i_local = (uint64_t)append_uint32(cp,SUB164(auVar2 / ZEXT816(1000000000),0));
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar4;
      cp_00 = append_uint32(cp,SUB164(auVar1 / ZEXT816(1000000000),0));
      i_local = (uint64_t)append_sub32(cp_00,(uint32_t)(uVar4 % 1000000000));
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = i;
    cp_local = append_sub32((uchar *)i_local,SUB164(auVar3 % ZEXT816(1000000000),0));
  }
  return cp_local;
}

Assistant:

static inline unsigned char *append_uint64(unsigned char *cp, uint64_t i) {
    uint64_t j;

    if (i <= 0xffffffff)
	return append_uint32(cp, i);

    if ((j = i/1000000000) > 1000000000) {
	cp = append_uint32(cp, j/1000000000);
	j %= 1000000000;
	cp = append_sub32(cp, j);
    } else {
	cp = append_uint32(cp, i / 1000000000);
    }
    cp = append_sub32(cp, i % 1000000000);

    return cp;
}